

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O0

int secp256k1_bulletproof_rangeproof_verify_impl
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_scratch *scratch,uchar **proof,
              size_t n_proofs,size_t plen,size_t nbits,uint64_t **min_value,secp256k1_ge **commitp,
              size_t n_commits,secp256k1_ge *value_gen,secp256k1_bulletproof_generators *gens,
              uchar **extra_commit,size_t *extra_commit_len)

{
  int iVar1;
  size_t sVar2;
  secp256k1_sha256 *psVar3;
  ulong in_RCX;
  undefined8 *puVar4;
  long in_RDX;
  ulong in_R8;
  unsigned_long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  uchar *in_stack_00000018;
  secp256k1_ge *in_stack_00000020;
  uchar vbuf [8];
  uchar len [4];
  size_t j;
  int overflow;
  secp256k1_ge sge;
  secp256k1_ge age;
  secp256k1_scalar mu;
  secp256k1_scalar taux;
  uchar randomizer61 [32];
  uchar commit [32];
  secp256k1_sha256 sha256;
  int same_generators;
  size_t i;
  int ret;
  secp256k1_bulletproof_innerproduct_context *innp_ctx;
  secp256k1_bulletproof_vfy_ecmult_context *ecmult_data;
  secp256k1_scalar *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  secp256k1_scratch *in_stack_fffffffffffffdd8;
  secp256k1_sha256 *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdec;
  undefined1 in_stack_fffffffffffffded;
  undefined1 in_stack_fffffffffffffdee;
  undefined1 in_stack_fffffffffffffdef;
  undefined1 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf1;
  undefined1 in_stack_fffffffffffffdf2;
  undefined1 in_stack_fffffffffffffdf3;
  undefined1 in_stack_fffffffffffffdf4;
  undefined1 in_stack_fffffffffffffdf5;
  undefined1 in_stack_fffffffffffffdf6;
  undefined1 in_stack_fffffffffffffdf7;
  uchar *puVar5;
  secp256k1_sha256 *a;
  undefined4 in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  secp256k1_scalar *in_stack_fffffffffffffe08;
  secp256k1_scalar *in_stack_fffffffffffffe10;
  secp256k1_ge *in_stack_fffffffffffffe18;
  secp256k1_ge *in_stack_fffffffffffffe60;
  secp256k1_ge *in_stack_fffffffffffffe68;
  uchar *in_stack_fffffffffffffe70;
  secp256k1_scalar local_148;
  secp256k1_scalar local_128;
  undefined1 local_108 [32];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  secp256k1_sha256 local_c8;
  undefined4 local_5c;
  ulong local_58;
  int local_4c;
  void *local_48;
  void *local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  long local_20;
  int local_4;
  
  local_5c = 1;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  sVar2 = secp256k1_popcountl(in_R9);
  if ((sVar2 == 1) && (local_38 < 0x41)) {
    if (local_30 < 0xe1) {
      local_4 = 0;
    }
    else if (local_30 < 0x528) {
      iVar1 = secp256k1_scratch_allocate_frame
                        (in_stack_fffffffffffffdd8,
                         CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                         (size_t)in_stack_fffffffffffffdc8);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        local_40 = secp256k1_scratch_alloc
                             (in_stack_fffffffffffffdd8,
                              CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
        local_48 = secp256k1_scratch_alloc
                             (in_stack_fffffffffffffdd8,
                              CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
        secp256k1_ge_is_infinity(in_stack_00000020);
        for (local_58 = 1; local_58 < local_28; local_58 = local_58 + 1) {
          secp256k1_ge_is_infinity(in_stack_00000020 + local_58);
          iVar1 = secp256k1_fe_equal_var
                            ((secp256k1_fe *)
                             CONCAT17(in_stack_fffffffffffffdf7,
                                      CONCAT16(in_stack_fffffffffffffdf6,
                                               CONCAT15(in_stack_fffffffffffffdf5,
                                                        CONCAT14(in_stack_fffffffffffffdf4,
                                                                 CONCAT13(in_stack_fffffffffffffdf3,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffdf2,
                                                  CONCAT11(in_stack_fffffffffffffdf1,
                                                           in_stack_fffffffffffffdf0))))))),
                             (secp256k1_fe *)
                             CONCAT17(in_stack_fffffffffffffdef,
                                      CONCAT16(in_stack_fffffffffffffdee,
                                               CONCAT15(in_stack_fffffffffffffded,
                                                        CONCAT14(in_stack_fffffffffffffdec,
                                                                 in_stack_fffffffffffffde8)))));
          if ((iVar1 == 0) ||
             (iVar1 = secp256k1_fe_equal_var
                                ((secp256k1_fe *)
                                 CONCAT17(in_stack_fffffffffffffdf7,
                                          CONCAT16(in_stack_fffffffffffffdf6,
                                                   CONCAT15(in_stack_fffffffffffffdf5,
                                                            CONCAT14(in_stack_fffffffffffffdf4,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffdf3,
                                                  CONCAT12(in_stack_fffffffffffffdf2,
                                                           CONCAT11(in_stack_fffffffffffffdf1,
                                                                    in_stack_fffffffffffffdf0)))))))
                                 ,(secp256k1_fe *)
                                  CONCAT17(in_stack_fffffffffffffdef,
                                           CONCAT16(in_stack_fffffffffffffdee,
                                                    CONCAT15(in_stack_fffffffffffffded,
                                                             CONCAT14(in_stack_fffffffffffffdec,
                                                                      in_stack_fffffffffffffde8)))))
             , iVar1 == 0)) {
            local_5c = 0;
          }
        }
        for (local_58 = 0; local_58 < local_28; local_58 = local_58 + 1) {
          memset(&local_e8,0,0x20);
          memset(local_108,0,0x20);
          if ((in_stack_00000008 != 0) && (*(long *)(in_stack_00000008 + local_58 * 8) != 0)) {
            secp256k1_sha256_initialize(&local_c8);
            secp256k1_sha256_write
                      (in_stack_fffffffffffffde0,(uchar *)in_stack_fffffffffffffdd8,
                       CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
            in_stack_fffffffffffffdf4 = SUB81(in_stack_00000018,0);
            in_stack_fffffffffffffdf5 = (undefined1)((ulong)in_stack_00000018 >> 8);
            in_stack_fffffffffffffdf6 = (undefined1)((ulong)in_stack_00000018 >> 0x10);
            in_stack_fffffffffffffdf7 = (undefined1)((ulong)in_stack_00000018 >> 0x18);
            secp256k1_sha256_write
                      (in_stack_fffffffffffffde0,(uchar *)in_stack_fffffffffffffdd8,
                       CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
            for (puVar5 = (uchar *)0x0; puVar5 < in_stack_00000018; puVar5 = puVar5 + 1) {
              in_stack_fffffffffffffdf0 =
                   (undefined1)
                   ((ulong)*(undefined8 *)
                            (*(long *)(in_stack_00000008 + local_58 * 8) + (long)puVar5 * 8) >> 0x20
                   );
              in_stack_fffffffffffffdf1 =
                   (undefined1)
                   ((ulong)*(undefined8 *)
                            (*(long *)(in_stack_00000008 + local_58 * 8) + (long)puVar5 * 8) >> 0x28
                   );
              in_stack_fffffffffffffdf2 =
                   (undefined1)
                   ((ulong)*(undefined8 *)
                            (*(long *)(in_stack_00000008 + local_58 * 8) + (long)puVar5 * 8) >> 0x30
                   );
              in_stack_fffffffffffffdf3 =
                   (undefined1)
                   ((ulong)*(undefined8 *)
                            (*(long *)(in_stack_00000008 + local_58 * 8) + (long)puVar5 * 8) >> 0x38
                   );
              secp256k1_sha256_write
                        (in_stack_fffffffffffffde0,(uchar *)in_stack_fffffffffffffdd8,
                         CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
            }
            secp256k1_sha256_finalize
                      ((secp256k1_sha256 *)
                       CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),puVar5);
          }
          for (puVar5 = (uchar *)0x0; puVar5 < in_stack_00000018; puVar5 = puVar5 + 1) {
            secp256k1_bulletproof_update_commit
                      (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60
                      );
          }
          if ((j != 0) && (*(long *)(j + local_58 * 8) != 0)) {
            secp256k1_sha256_initialize(&local_c8);
            secp256k1_sha256_write
                      (in_stack_fffffffffffffde0,(uchar *)in_stack_fffffffffffffdd8,
                       CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
            secp256k1_sha256_write
                      (in_stack_fffffffffffffde0,(uchar *)in_stack_fffffffffffffdd8,
                       CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
            secp256k1_sha256_finalize
                      ((secp256k1_sha256 *)
                       CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),puVar5);
          }
          iVar1 = secp256k1_bulletproof_deserialize_point
                            (in_stack_fffffffffffffe18,(uchar *)in_stack_fffffffffffffe10,
                             (size_t)in_stack_fffffffffffffe08,
                             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
          if ((iVar1 == 0) ||
             (iVar1 = secp256k1_bulletproof_deserialize_point
                                (in_stack_fffffffffffffe18,(uchar *)in_stack_fffffffffffffe10,
                                 (size_t)in_stack_fffffffffffffe08,
                                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00)),
             iVar1 == 0)) {
            return 0;
          }
          secp256k1_bulletproof_update_commit
                    (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)in_stack_fffffffffffffde0,
                     (uchar *)in_stack_fffffffffffffdd8,
                     (int *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          if ((in_stack_fffffffffffffe04 != 0) ||
             (iVar1 = secp256k1_scalar_is_zero
                                ((secp256k1_scalar *)((long)local_40 + local_58 * 0x2f0 + 0x1e0)),
             iVar1 != 0)) {
            secp256k1_scratch_deallocate_frame((secp256k1_scratch *)0x111e97);
            return 0;
          }
          secp256k1_bulletproof_update_commit
                    (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)in_stack_fffffffffffffde0,
                     (uchar *)in_stack_fffffffffffffdd8,
                     (int *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          if ((in_stack_fffffffffffffe04 != 0) ||
             (iVar1 = secp256k1_scalar_is_zero
                                ((secp256k1_scalar *)((long)local_40 + local_58 * 0x2f0 + 0x40)),
             iVar1 != 0)) {
            secp256k1_scratch_deallocate_frame((secp256k1_scratch *)0x111f27);
            return 0;
          }
          iVar1 = secp256k1_bulletproof_deserialize_point
                            (in_stack_fffffffffffffe18,(uchar *)in_stack_fffffffffffffe10,
                             (size_t)in_stack_fffffffffffffe08,
                             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
          if ((iVar1 == 0) ||
             (iVar1 = secp256k1_bulletproof_deserialize_point
                                (in_stack_fffffffffffffe18,(uchar *)in_stack_fffffffffffffe10,
                                 (size_t)in_stack_fffffffffffffe08,
                                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00)),
             iVar1 == 0)) {
            return 0;
          }
          secp256k1_bulletproof_update_commit
                    (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)in_stack_fffffffffffffde0,
                     (uchar *)in_stack_fffffffffffffdd8,
                     (int *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          if ((in_stack_fffffffffffffe04 != 0) ||
             (iVar1 = secp256k1_scalar_is_zero
                                ((secp256k1_scalar *)((long)local_40 + local_58 * 0x2f0 + 0xe0)),
             iVar1 != 0)) {
            secp256k1_scratch_deallocate_frame((secp256k1_scratch *)0x112090);
            return 0;
          }
          secp256k1_scalar_inverse_var
                    ((secp256k1_scalar *)
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     in_stack_fffffffffffffdc8);
          puVar4 = (undefined8 *)((long)local_40 + local_58 * 0x2f0);
          *(undefined8 *)((long)local_40 + local_58 * 0x2f0 + 0x20) = *puVar4;
          *(undefined8 *)((long)local_40 + local_58 * 0x2f0 + 0x28) = puVar4[1];
          *(undefined8 *)((long)local_40 + local_58 * 0x2f0 + 0x30) = puVar4[2];
          *(undefined8 *)((long)local_40 + local_58 * 0x2f0 + 0x38) = puVar4[3];
          in_stack_fffffffffffffde0 = (secp256k1_sha256 *)0x0;
          while (a = in_stack_fffffffffffffde0,
                psVar3 = (secp256k1_sha256 *)secp256k1_floor_lg(local_38),
                in_stack_fffffffffffffde0 < psVar3) {
            secp256k1_scalar_sqr(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
            in_stack_fffffffffffffde0 = (secp256k1_sha256 *)((long)a->s + 1);
          }
          secp256k1_scalar_sqr(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
          secp256k1_scalar_negate
                    ((secp256k1_scalar *)in_stack_fffffffffffffde0,
                     (secp256k1_scalar *)in_stack_fffffffffffffdd8);
          secp256k1_sha256_initialize(&local_c8);
          secp256k1_sha256_write
                    (in_stack_fffffffffffffde0,(uchar *)in_stack_fffffffffffffdd8,
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          secp256k1_sha256_write
                    (in_stack_fffffffffffffde0,(uchar *)in_stack_fffffffffffffdd8,
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          secp256k1_sha256_finalize
                    ((secp256k1_sha256 *)
                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),(uchar *)a);
          secp256k1_sha256_initialize(&local_c8);
          secp256k1_sha256_write
                    (in_stack_fffffffffffffde0,(uchar *)in_stack_fffffffffffffdd8,
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          secp256k1_sha256_finalize
                    ((secp256k1_sha256 *)
                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),(uchar *)a);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)in_stack_fffffffffffffde0,
                     (uchar *)in_stack_fffffffffffffdd8,
                     (int *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          if ((in_stack_fffffffffffffe04 != 0) ||
             (iVar1 = secp256k1_scalar_is_zero
                                ((secp256k1_scalar *)((long)local_40 + local_58 * 0x2f0 + 0x1c0)),
             iVar1 != 0)) {
            secp256k1_scratch_deallocate_frame((secp256k1_scratch *)0x112325);
            return 0;
          }
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)in_stack_fffffffffffffde0,
                     (uchar *)in_stack_fffffffffffffdd8,
                     (int *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          if ((in_stack_fffffffffffffe04 != 0) ||
             (iVar1 = secp256k1_scalar_is_zero(&local_128), iVar1 != 0)) {
            secp256k1_scratch_deallocate_frame((secp256k1_scratch *)0x112381);
            return 0;
          }
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)in_stack_fffffffffffffde0,
                     (uchar *)in_stack_fffffffffffffdd8,
                     (int *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          if ((in_stack_fffffffffffffe04 != 0) ||
             (iVar1 = secp256k1_scalar_is_zero(&local_148), iVar1 != 0)) {
            secp256k1_scratch_deallocate_frame((secp256k1_scratch *)0x1123e1);
            return 0;
          }
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)in_stack_fffffffffffffde0,
                     (uchar *)in_stack_fffffffffffffdd8,
                     (int *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          if ((in_stack_fffffffffffffe04 != 0) ||
             (iVar1 = secp256k1_scalar_is_zero
                                ((secp256k1_scalar *)((long)local_40 + local_58 * 0x2f0 + 0x200)),
             iVar1 != 0)) {
            secp256k1_scratch_deallocate_frame((secp256k1_scratch *)0x112470);
            return 0;
          }
          memcpy((void *)((long)local_40 + local_58 * 0x2f0 + 0x100),&stack0xfffffffffffffe60,0x58);
          memcpy((void *)((long)local_40 + local_58 * 0x2f0 + 0x158),&stack0xfffffffffffffe08,0x58);
          *(ulong *)((long)local_40 + local_58 * 0x2f0 + 0x1b0) = local_38 * (long)in_stack_00000018
          ;
          *(undefined8 *)((long)local_40 + local_58 * 0x2f0 + 0x1b8) = 0;
          *(secp256k1_ge **)((long)local_40 + local_58 * 0x2f0 + 0x220) =
               in_stack_00000020 + local_58;
          if (in_stack_00000008 == 0) {
            in_stack_fffffffffffffdd8 = (secp256k1_scratch *)0x0;
          }
          else {
            in_stack_fffffffffffffdd8 = *(secp256k1_scratch **)(in_stack_00000008 + local_58 * 8);
          }
          *(secp256k1_scratch **)((long)local_40 + local_58 * 0x2f0 + 0x230) =
               in_stack_fffffffffffffdd8;
          *(undefined8 *)((long)local_40 + local_58 * 0x2f0 + 0x228) =
               *(undefined8 *)(in_stack_00000010 + local_58 * 8);
          *(uchar **)((long)local_40 + local_58 * 0x2f0 + 0x238) = in_stack_00000018;
          secp256k1_scalar_mul
                    (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                     (secp256k1_scalar *)
                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
          secp256k1_scalar_add
                    ((secp256k1_scalar *)
                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     (secp256k1_scalar *)a,
                     (secp256k1_scalar *)
                     CONCAT17(in_stack_fffffffffffffdf7,
                              CONCAT16(in_stack_fffffffffffffdf6,
                                       CONCAT15(in_stack_fffffffffffffdf5,
                                                CONCAT14(in_stack_fffffffffffffdf4,
                                                         CONCAT13(in_stack_fffffffffffffdf3,
                                                                  CONCAT12(in_stack_fffffffffffffdf2
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffdf1,
                                                  in_stack_fffffffffffffdf0))))))));
          *(long *)((long)local_48 + local_58 * 0x80) = *(long *)(local_20 + local_58 * 8) + 0xc1;
          *(uint64_t *)((long)local_48 + local_58 * 0x80 + 8) = local_148.d[0];
          *(uint64_t *)((long)local_48 + local_58 * 0x80 + 0x10) = local_148.d[1];
          *(uint64_t *)((long)local_48 + local_58 * 0x80 + 0x18) = local_148.d[2];
          *(uint64_t *)((long)local_48 + local_58 * 0x80 + 0x20) = local_148.d[3];
          *(undefined8 *)((long)local_48 + local_58 * 0x80 + 0x48) = local_e8;
          *(undefined8 *)((long)local_48 + local_58 * 0x80 + 0x50) = local_e0;
          *(undefined8 *)((long)local_48 + local_58 * 0x80 + 0x58) = local_d8;
          *(undefined8 *)((long)local_48 + local_58 * 0x80 + 0x60) = local_d0;
          puVar4 = (undefined8 *)((long)local_40 + local_58 * 0x2f0);
          *(undefined8 *)((long)local_48 + local_58 * 0x80 + 0x28) = *puVar4;
          *(undefined8 *)((long)local_48 + local_58 * 0x80 + 0x30) = puVar4[1];
          *(undefined8 *)((long)local_48 + local_58 * 0x80 + 0x38) = puVar4[2];
          *(undefined8 *)((long)local_48 + local_58 * 0x80 + 0x40) = puVar4[3];
          *(code **)((long)local_48 + local_58 * 0x80 + 0x68) =
               secp256k1_bulletproof_rangeproof_vfy_callback;
          *(void **)((long)local_48 + local_58 * 0x80 + 0x70) =
               (void *)((long)local_40 + local_58 * 0x2f0);
          *(uchar **)((long)local_48 + local_58 * 0x80 + 0x78) = in_stack_00000018 + 5;
        }
        local_4c = secp256k1_bulletproof_inner_product_verify_impl
                             ((secp256k1_ecmult_context *)taux.d[1],(secp256k1_scratch *)taux.d[0],
                              (secp256k1_bulletproof_generators *)mu.d[3],mu.d[2],
                              (secp256k1_bulletproof_innerproduct_context *)mu.d[1],mu.d[0],
                              randomizer61._0_8_,randomizer61._8_4_);
        secp256k1_scratch_deallocate_frame((secp256k1_scratch *)0x112862);
        local_4 = local_4c;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int secp256k1_bulletproof_rangeproof_verify_impl(const secp256k1_ecmult_context *ecmult_ctx, secp256k1_scratch *scratch, const unsigned char* const* proof, const size_t n_proofs, const size_t plen, size_t nbits, const uint64_t* const* min_value, const secp256k1_ge* const* commitp, size_t n_commits, const secp256k1_ge *value_gen, const secp256k1_bulletproof_generators *gens, const unsigned char* const* extra_commit, size_t *extra_commit_len) {
    secp256k1_bulletproof_vfy_ecmult_context *ecmult_data;
    secp256k1_bulletproof_innerproduct_context *innp_ctx;
    int ret;
    size_t i;
    int same_generators = 1;

    /* sanity-check input */
    if (secp256k1_popcountl(nbits) != 1 || nbits > MAX_NBITS) {
        return 0;
    }
    if (plen < 64 + 128 + 1 + 32) {  /* inner product argument will do a more precise check */
        return 0;
    }
    if (plen > SECP256K1_BULLETPROOF_MAX_PROOF) {
        return 0;
    }

    if (!secp256k1_scratch_allocate_frame(scratch, n_proofs * (sizeof(*ecmult_data) + sizeof(*innp_ctx)), 2)) {
        return 0;
    }
    ecmult_data = (secp256k1_bulletproof_vfy_ecmult_context *)secp256k1_scratch_alloc(scratch, n_proofs * sizeof(*ecmult_data));
    innp_ctx = (secp256k1_bulletproof_innerproduct_context *)secp256k1_scratch_alloc(scratch, n_proofs * sizeof(*innp_ctx));

    /* Check if all generators are equal. If so, we can amortize all their scalar multiplications
     * by them and save one scalar-ge multiplication per proof. */
    VERIFY_CHECK(!secp256k1_ge_is_infinity(&value_gen[0]));
    for (i = 1; i < n_proofs; i++) {
        VERIFY_CHECK(!secp256k1_ge_is_infinity(&value_gen[i]));
        if (!secp256k1_fe_equal_var(&value_gen[i].x, &value_gen[i - 1].x) ||
            !secp256k1_fe_equal_var(&value_gen[i].y, &value_gen[i - 1].y)) {
            same_generators = 0;
        }
    }

    for (i = 0; i < n_proofs; i++) {
        secp256k1_sha256 sha256;
        unsigned char commit[32] = {0};
        unsigned char randomizer61[32] = {0};  /* randomizer for eq (61) so we can add it to eq (62) to save a separate multiexp */
        secp256k1_scalar taux, mu;
        secp256k1_ge age, sge;
        int overflow;
        size_t j;

        /* Commit to all input data: min value, pedersen commit, asset generator, extra_commit */
        if (min_value != NULL && min_value[i] != NULL) {
            unsigned char len[4];
            secp256k1_sha256_initialize(&sha256);
            secp256k1_sha256_write(&sha256, commit, 32);
            len[0] = n_commits;
            len[1] = n_commits >> 8;
            len[2] = n_commits >> 16;
            len[3] = n_commits >> 24;
            secp256k1_sha256_write(&sha256, len, 4);
            for (j = 0; j < n_commits; j++) {
                unsigned char vbuf[8];
                vbuf[0] = min_value[i][j];
                vbuf[1] = min_value[i][j] >> 8;
                vbuf[2] = min_value[i][j] >> 16;
                vbuf[3] = min_value[i][j] >> 24;
                vbuf[4] = min_value[i][j] >> 32;
                vbuf[5] = min_value[i][j] >> 40;
                vbuf[6] = min_value[i][j] >> 48;
                vbuf[7] = min_value[i][j] >> 56;
                secp256k1_sha256_write(&sha256, vbuf, 8);
            }
            secp256k1_sha256_finalize(&sha256, commit);
        }
        for (j = 0; j < n_commits; j++) {
            secp256k1_bulletproof_update_commit(commit, &commitp[i][j], &value_gen[i]);
        }
        if (extra_commit != NULL && extra_commit[i] != NULL) {
            secp256k1_sha256_initialize(&sha256);
            secp256k1_sha256_write(&sha256, commit, 32);
            secp256k1_sha256_write(&sha256, extra_commit[i], extra_commit_len[i]);
            secp256k1_sha256_finalize(&sha256, commit);
        }

        /* Compute y, z, x */
        if (!secp256k1_bulletproof_deserialize_point(&age, &proof[i][64], 0, 4) ||
            !secp256k1_bulletproof_deserialize_point(&sge, &proof[i][64], 1, 4)) {
            return 0;
        }

        secp256k1_bulletproof_update_commit(commit, &age, &sge);
        secp256k1_scalar_set_b32(&ecmult_data[i].y, commit, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].y)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }
        secp256k1_bulletproof_update_commit(commit, &age, &sge);
        secp256k1_scalar_set_b32(&ecmult_data[i].z, commit, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].z)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }

        if (!secp256k1_bulletproof_deserialize_point(&ecmult_data[i].t1, &proof[i][64], 2, 4) ||
            !secp256k1_bulletproof_deserialize_point(&ecmult_data[i].t2, &proof[i][64], 3, 4)) {
            return 0;
        }

        secp256k1_bulletproof_update_commit(commit, &ecmult_data[i].t1, &ecmult_data[i].t2);
        secp256k1_scalar_set_b32(&ecmult_data[i].x, commit, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].x)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }

        /* compute exponent offsets */
        secp256k1_scalar_inverse_var(&ecmult_data[i].yinv, &ecmult_data[i].y);  /* TODO somehow batch this w the inner-product argument inverse */
        ecmult_data[i].yinvn = ecmult_data[i].yinv;
        for (j = 0; j < secp256k1_floor_lg(nbits); j++) {
            secp256k1_scalar_sqr(&ecmult_data[i].yinvn, &ecmult_data[i].yinvn);
        }
        secp256k1_scalar_sqr(&ecmult_data[i].zsq, &ecmult_data[i].z);
        secp256k1_scalar_negate(&ecmult_data[i].negz, &ecmult_data[i].z);

        /* Update commit with remaining data for the inner product proof */
        secp256k1_sha256_initialize(&sha256);
        secp256k1_sha256_write(&sha256, commit, 32);
        secp256k1_sha256_write(&sha256, &proof[i][0], 64);
        secp256k1_sha256_finalize(&sha256, commit);

        secp256k1_sha256_initialize(&sha256);
        secp256k1_sha256_write(&sha256, commit, 32);
        secp256k1_sha256_finalize(&sha256, randomizer61);
        secp256k1_scalar_set_b32(&ecmult_data[i].randomizer61, randomizer61, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].randomizer61)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }

        /* Deserialize everything else */
        secp256k1_scalar_set_b32(&taux, &proof[i][0], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&taux)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }
        secp256k1_scalar_set_b32(&mu, &proof[i][32], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&mu)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }
        /* A little sketchy, we read t (l(x) . r(x)) off the front of the inner product proof,
         * which we otherwise treat as a black box */
        secp256k1_scalar_set_b32(&ecmult_data[i].t, &proof[i][64 + 128 + 1], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].t)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }

        /* Verify inner product proof */
        ecmult_data[i].a = age;
        ecmult_data[i].s = sge;
        ecmult_data[i].n = nbits * n_commits;
        ecmult_data[i].count = 0;
        ecmult_data[i].asset = &value_gen[i];
        ecmult_data[i].min_value = min_value == NULL ? NULL : min_value[i];
        ecmult_data[i].commit = commitp[i];
        ecmult_data[i].n_commits = n_commits;
        secp256k1_scalar_mul(&taux, &taux, &ecmult_data[i].randomizer61);
        secp256k1_scalar_add(&mu, &mu, &taux);

        innp_ctx[i].proof = &proof[i][64 + 128 + 1];
        innp_ctx[i].p_offs = mu;
        memcpy(innp_ctx[i].commit, commit, 32);
        innp_ctx[i].yinv = ecmult_data[i].yinv;
        innp_ctx[i].rangeproof_cb = secp256k1_bulletproof_rangeproof_vfy_callback;
        innp_ctx[i].rangeproof_cb_data = (void *) &ecmult_data[i];
        innp_ctx[i].n_extra_rangeproof_points = 5 + n_commits;
    }

    ret = secp256k1_bulletproof_inner_product_verify_impl(ecmult_ctx, scratch, gens, nbits * n_commits, innp_ctx, n_proofs, plen - (64 + 128 + 1), same_generators);
    secp256k1_scratch_deallocate_frame(scratch);
    return ret;
}